

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::NetSymbol::NetSymbol
          (NetSymbol *this,string_view name,SourceLocation loc,NetType *netType)

{
  byte *pbVar1;
  
  ValueSymbol::ValueSymbol
            (&this->super_ValueSymbol,Net,name,loc,(bitmask<slang::ast::DeclaredTypeFlags>)0x40);
  this->netType = netType;
  this->expansionHint = None;
  this->isImplicit = false;
  (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged = false;
  DeclaredType::setLink(&(this->super_ValueSymbol).declaredType,&netType->declaredType);
  if (netType->netKind == Interconnect) {
    pbVar1 = (byte *)((long)&(this->super_ValueSymbol).declaredType.flags.m_bits + 1);
    *pbVar1 = *pbVar1 | 0x80;
  }
  return;
}

Assistant:

NetSymbol::NetSymbol(std::string_view name, SourceLocation loc, const NetType& netType) :
    ValueSymbol(SymbolKind::Net, name, loc, DeclaredTypeFlags::NetType), netType(netType) {

    auto dt = getDeclaredType();
    dt->setLink(netType.declaredType);
    if (netType.netKind == NetType::Interconnect)
        dt->addFlags(DeclaredTypeFlags::InterconnectNet);
}